

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 float32_to_floatx80_mips(float32 a,float_status *status)

{
  int iVar1;
  uint uVar2;
  ulong uVar4;
  uint uVar5;
  floatx80 fVar6;
  floatx80 fVar7;
  undefined1 in_stack_00000008 [24];
  uint uVar3;
  
  uVar4 = (ulong)a;
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    uVar4 = (ulong)(a & 0x80000000);
  }
  uVar3 = (uint)uVar4;
  uVar2 = uVar3 & 0x7fffff;
  iVar1 = (int)(float_status *)(uVar4 >> 0x1f);
  if ((char)(uVar4 >> 0x17) == '\0') {
    if ((uVar4 & 0x7fffff) == 0) {
      return (floatx80)(ZEXT416((uint)(iVar1 << 0xf)) << 0x40);
    }
    uVar3 = 0x1f;
    if ((uVar4 & 0x7fffff) != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar2 = uVar2 << ((char)(uVar3 ^ 0x1f) - 8U & 0x1f);
    uVar5 = 9 - (uVar3 ^ 0x1f);
LAB_0071dced:
    fVar6.low = (ulong)(uVar2 | 0x800000) << 0x28;
    fVar6._8_4_ = iVar1 * 0x8000 + uVar5 + 0x3f80;
    fVar6._12_4_ = 0;
    return fVar6;
  }
  uVar5 = (uint)(uVar4 >> 0x17) & 0xff;
  if (uVar5 != 0xff) goto LAB_0071dced;
  if ((uVar4 & 0x7fffff) == 0) {
    fVar7._8_4_ = iVar1 << 0xf | 0x7fff;
    fVar7.low = 0x8000000000000000;
    fVar7._12_4_ = 0;
    return fVar7;
  }
  if (status->snan_bit_is_one == '\0') {
    if ((uVar4 & 0x3fffff) == 0 || (uVar3 & 0x7fc00000) != 0x7f800000) goto LAB_0071dccb;
  }
  else if (uVar3 * 2 < 0xff800000) goto LAB_0071dccb;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_0071dccb:
  fVar6 = commonNaNToFloatx80((commonNaNT)in_stack_00000008,(float_status *)(uVar4 >> 0x1f));
  return fVar6;
}

Assistant:

floatx80 float32_to_floatx80(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    if ( aExp == 0xFF ) {
        if (aSig) {
            return commonNaNToFloatx80(float32ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    aSig |= 0x00800000;
    return packFloatx80( aSign, aExp + 0x3F80, ( (uint64_t) aSig )<<40 );

}